

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

void __thiscall
pstore::index::details::internal_node::internal_node(internal_node *this,internal_node *rhs)

{
  uint uVar1;
  index_pointer *__first;
  index_pointer *__result;
  index_pointer *local_28;
  index_pointer *first;
  internal_node *rhs_local;
  internal_node *this_local;
  
  *(undefined8 *)(this->signature_)._M_elems = 0x6c616e7265746e49;
  this->bitmap_ = rhs->bitmap_;
  local_28 = (index_pointer *)this->children_;
  do {
    index_pointer::index_pointer(local_28);
    local_28 = local_28 + 8;
  } while ((internal_node *)local_28 != this + 1);
  __first = std::begin<pstore::index::details::index_pointer_const,1ul>(&rhs->children_);
  uVar1 = size(rhs);
  __result = std::begin<pstore::index::details::index_pointer,1ul>(&this->children_);
  std::copy<pstore::index::details::index_pointer_const*,pstore::index::details::index_pointer*>
            (__first,__first + uVar1,__result);
  return;
}

Assistant:

internal_node::internal_node (internal_node const & rhs)
                    : bitmap_{rhs.bitmap_} {

                auto const * const first = std::begin (rhs.children_);
                std::copy (first, first + rhs.size (), std::begin (children_));
            }